

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int stb_vorbis_get_samples_short(stb_vorbis *f,int channels,short **buffer,int len)

{
  int iVar1;
  int in_ECX;
  stb_vorbis *in_RDX;
  int in_ESI;
  long in_RDI;
  int unaff_retaddr;
  int k;
  int n;
  float **outputs;
  int local_30;
  int d_offset;
  float ***in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  
  d_offset = 0;
  while( true ) {
    if (in_ECX <= d_offset) {
      return d_offset;
    }
    local_30 = *(int *)(in_RDI + 0x768) - *(int *)(in_RDI + 0x764);
    if (in_ECX <= d_offset + local_30) {
      local_30 = in_ECX - d_offset;
    }
    if (local_30 != 0) {
      convert_samples_short
                (in_ESI,(short **)in_RDX,in_ECX,in_stack_ffffffffffffffe0,
                 (float **)in_stack_ffffffffffffffd8,d_offset,unaff_retaddr);
    }
    d_offset = local_30 + d_offset;
    *(int *)(in_RDI + 0x764) = local_30 + *(int *)(in_RDI + 0x764);
    if (d_offset == in_ECX) break;
    iVar1 = stb_vorbis_get_frame_float
                      (in_RDX,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffd8);
    if (iVar1 == 0) {
      return d_offset;
    }
  }
  return d_offset;
}

Assistant:

int stb_vorbis_get_samples_short(stb_vorbis *f, int channels, short **buffer, int len)
{
   float **outputs;
   int n=0;
   while (n < len) {
      int k = f->channel_buffer_end - f->channel_buffer_start;
      if (n+k >= len) k = len - n;
      if (k)
         convert_samples_short(channels, buffer, n, f->channels, f->channel_buffers, f->channel_buffer_start, k);
      n += k;
      f->channel_buffer_start += k;
      if (n == len) break;
      if (!stb_vorbis_get_frame_float(f, NULL, &outputs)) break;
   }
   return n;
}